

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O0

void __thiscall QDtls::QDtls(QDtls *this,SslMode mode,QObject *parent)

{
  bool bVar1;
  QObjectPrivate *t;
  QDtlsPrivate *configuration;
  QTlsBackend *this_00;
  pointer pDVar2;
  QObject *in_RDX;
  undefined4 in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QTlsBackend *tlsBackend;
  QDtlsPrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff28;
  QDtlsPrivate *in_stack_ffffffffffffff30;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *this_01;
  char *in_stack_ffffffffffffff78;
  QDebug local_50;
  char local_48 [32];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  t = (QObjectPrivate *)operator_new(0x80);
  QDtlsPrivate::QDtlsPrivate(in_stack_ffffffffffffff30);
  QObject::QObject(in_RDI,t,in_RDX);
  *(undefined ***)in_RDI = &PTR_metaObject_004a0cd0;
  configuration = d_func((QDtls *)0x3b9857);
  this_00 = QSslSocketPrivate::tlsBackendInUse();
  if (this_00 == (QTlsBackend *)0x0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_ad805c::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_ad805c::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3b98c5);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)t,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (char *)in_stack_ffffffffffffff28,(char *)0x3b98de);
      QMessageLogger::warning(local_48,"No TLS backend found, QDtls is unsupported");
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    this_01 = (QLoggingCategoryMacroHolder<(QtMsgType)1> *)&configuration->backend;
    (**(code **)(*(long *)this_00 + 0xd0))(this_00,in_RDI,in_ESI);
    std::
    unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>::
    reset((unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>
           *)this_01,(pointer)in_stack_ffffffffffffff28);
    pDVar2 = std::
             unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>
             ::get((unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>
                    *)0x3b9943);
    if (pDVar2 == (pointer)0x0) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_ad805c::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(this_01,in_stack_ffffffffffffff28);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_ad805c::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3b99a3);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_RDI,(char *)t,(int)((ulong)this_01 >> 0x20),
                   (char *)in_stack_ffffffffffffff28,(char *)0x3b99b9);
        QMessageLogger::warning();
        in_stack_ffffffffffffff28 =
             (QLoggingCategory *)QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff78);
        (**(code **)(*(long *)this_00 + 0x90))(&stack0xffffffffffffff78);
        QDebug::operator<<((QDebug *)in_RDI,(QString *)t);
        QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff78);
        QString::~QString((QString *)0x3b9a1d);
        QDebug::~QDebug(&local_50);
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
    QSslConfiguration::defaultDtlsConfiguration();
    setDtlsConfiguration((QDtls *)in_RDX,(QSslConfiguration *)configuration);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x3b9a5c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDtls::QDtls(QSslSocket::SslMode mode, QObject *parent)
    : QObject(*new QDtlsPrivate, parent)
{
    Q_D(QDtls);
    const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend found, QDtls is unsupported");
        return;
    }
    d->backend.reset(tlsBackend->createDtlsCryptograph(this, mode));
    if (!d->backend.get()) {
        qCWarning(lcSsl) << "TLS backend" << tlsBackend->backendName()
                         << "does not support the protocol DTLS";
    }
    setDtlsConfiguration(QSslConfiguration::defaultDtlsConfiguration());
}